

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O0

PatternList *
parse_short(PatternList *__return_storage_ptr__,Tokens *tokens,
           vector<docopt::Option,_std::allocator<docopt::Option>_> *options)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  undefined8 this_00;
  bool bVar1;
  __type _Var2;
  int iVar3;
  reference pcVar4;
  reference this_01;
  string *__lhs;
  size_type sVar5;
  OptionError *pOVar6;
  element_type *peVar7;
  ulong uVar8;
  shared_ptr<docopt::Pattern> local_350;
  value local_340;
  char *local_318;
  allocator<char> local_309;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_308;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_300;
  string local_2f8;
  value local_2d8;
  string local_2b0;
  value local_290;
  undefined1 local_268 [8];
  string error_1;
  string *ttoken;
  undefined1 local_238 [8];
  value val;
  shared_ptr<docopt::Option> o_1;
  value local_1f0;
  undefined1 local_1c8 [8];
  shared_ptr<docopt::Option> o;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 local_150 [8];
  string error;
  Option *option;
  iterator __end2;
  iterator __begin2;
  vector<docopt::Option,_std::allocator<docopt::Option>_> *__range2;
  vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> similar;
  undefined1 local_d8 [8];
  string shortOpt;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  iterator i;
  string local_98;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  string token;
  vector<docopt::Option,_std::allocator<docopt::Option>_> *options_local;
  Tokens *tokens_local;
  PatternList *ret;
  
  token.field_2._8_8_ = options;
  Tokens::pop_abi_cxx11_((string *)local_40,tokens);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"-",&local_61);
  bVar1 = anon_unknown.dwarf_108a86::starts_with((string *)local_40,&local_60);
  if (!bVar1) {
    __assert_fail("starts_with(token, \"-\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/nsearch/vendor/docopt/docopt.cpp"
                  ,0x120,"PatternList parse_short(Tokens &, std::vector<Option> &)");
  }
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"--",(allocator *)((long)&i._M_current + 7));
  bVar1 = anon_unknown.dwarf_108a86::starts_with((string *)local_40,&local_98);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!starts_with(token, \"--\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/nsearch/vendor/docopt/docopt.cpp"
                  ,0x121,"PatternList parse_short(Tokens &, std::vector<Option> &)");
  }
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i._M_current + 7));
  local_a8._M_current = (char *)std::__cxx11::string::begin();
  __gnu_cxx::
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator++(&local_a8);
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::vector(__return_storage_ptr__);
  while( true ) {
    shortOpt.field_2._8_8_ = std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=
                      (&local_a8,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)((long)&shortOpt.field_2 + 8));
    if (!bVar1) {
      std::__cxx11::string::~string((string *)local_40);
      return __return_storage_ptr__;
    }
    similar.super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0x2d;
    pcVar4 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_a8);
    similar.super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = *pcVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_d8,
               (undefined1 *)
               ((long)&similar.
                       super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 6),2,
               (undefined1 *)
               ((long)&similar.
                       super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&similar.
                       super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_a8);
    std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>::vector
              ((vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *)&__range2)
    ;
    this_00 = token.field_2._8_8_;
    __end2 = std::vector<docopt::Option,_std::allocator<docopt::Option>_>::begin
                       ((vector<docopt::Option,_std::allocator<docopt::Option>_> *)
                        token.field_2._8_8_);
    option = (Option *)
             std::vector<docopt::Option,_std::allocator<docopt::Option>_>::end
                       ((vector<docopt::Option,_std::allocator<docopt::Option>_> *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<docopt::Option_*,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>
                                       *)&option), bVar1) {
      this_01 = __gnu_cxx::
                __normal_iterator<docopt::Option_*,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>
                ::operator*(&__end2);
      __lhs = docopt::Option::shortOption_abi_cxx11_(this_01);
      _Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_d8);
      if (_Var2) {
        error.field_2._8_8_ = this_01;
        std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>::push_back
                  ((vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *)
                   &__range2,(value_type *)((long)&error.field_2 + 8));
      }
      __gnu_cxx::
      __normal_iterator<docopt::Option_*,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>
      ::operator++(&__end2);
    }
    sVar5 = std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>::size
                      ((vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *)
                       &__range2);
    if (1 < sVar5) break;
    bVar1 = std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>::empty
                      ((vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *)
                       &__range2);
    if (bVar1) {
      o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
      std::vector<docopt::Option,std::allocator<docopt::Option>>::
      emplace_back<std::__cxx11::string&,char_const(&)[1],int>
                ((vector<docopt::Option,std::allocator<docopt::Option>> *)token.field_2._8_8_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 (char (*) [1])0x2d852c,
                 (int *)((long)&o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi + 4));
      std::vector<docopt::Option,_std::allocator<docopt::Option>_>::back
                ((vector<docopt::Option,_std::allocator<docopt::Option>_> *)token.field_2._8_8_);
      std::make_shared<docopt::Option,docopt::Option&>((Option *)local_1c8);
      bVar1 = Tokens::isParsingArgv(tokens);
      if (bVar1) {
        peVar7 = std::__shared_ptr_access<docopt::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<docopt::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_1c8);
        docopt::value::value(&local_1f0,true);
        docopt::LeafPattern::setValue(&peVar7->super_LeafPattern,&local_1f0);
        docopt::value::~value(&local_1f0);
      }
      this = &o_1.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::shared_ptr<docopt::Pattern>::shared_ptr<docopt::Option,void>
                ((shared_ptr<docopt::Pattern> *)this,(shared_ptr<docopt::Option> *)local_1c8);
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      push_back(__return_storage_ptr__,(value_type *)this);
      std::shared_ptr<docopt::Pattern>::~shared_ptr
                ((shared_ptr<docopt::Pattern> *)
                 &o_1.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::shared_ptr<docopt::Option>::~shared_ptr((shared_ptr<docopt::Option> *)local_1c8);
    }
    else {
      std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>::operator[]
                ((vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *)
                 &__range2,0);
      std::make_shared<docopt::Option,docopt::Option_const&>((Option *)((long)&val.variant + 0x18));
      docopt::value::value((value *)local_238);
      peVar7 = std::__shared_ptr_access<docopt::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<docopt::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(val.variant.field4 + 0x18));
      iVar3 = docopt::Option::argCount(peVar7);
      if (iVar3 != 0) {
        ttoken = (string *)std::__cxx11::string::end();
        bVar1 = __gnu_cxx::operator==
                          (&local_a8,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&ttoken);
        if (bVar1) {
          error_1.field_2._8_8_ = Tokens::current_abi_cxx11_(tokens);
          uVar8 = std::__cxx11::string::empty();
          if (((uVar8 & 1) != 0) ||
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)error_1.field_2._8_8_,"--"), bVar1)) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_268,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d8," requires an argument");
            pOVar6 = (OptionError *)__cxa_allocate_exception(0x10);
            Tokens::OptionError::runtime_error(pOVar6,(string *)local_268);
            __cxa_throw(pOVar6,&Tokens::OptionError::typeinfo,Tokens::OptionError::~OptionError);
          }
          Tokens::pop_abi_cxx11_(&local_2b0,tokens);
          docopt::value::value(&local_290,&local_2b0);
          docopt::value::operator=((value *)local_238,&local_290);
          docopt::value::~value(&local_290);
          std::__cxx11::string::~string((string *)&local_2b0);
        }
        else {
          local_300._M_current = local_a8._M_current;
          local_308._M_current = (char *)std::__cxx11::string::end();
          std::allocator<char>::allocator();
          std::__cxx11::string::
          string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                    ((string *)&local_2f8,local_300,local_308,&local_309);
          docopt::value::value(&local_2d8,&local_2f8);
          docopt::value::operator=((value *)local_238,&local_2d8);
          docopt::value::~value(&local_2d8);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::allocator<char>::~allocator(&local_309);
          local_318 = (char *)std::__cxx11::string::end();
          local_a8._M_current = local_318;
        }
      }
      bVar1 = Tokens::isParsingArgv(tokens);
      if (bVar1) {
        peVar7 = std::__shared_ptr_access<docopt::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<docopt::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)(val.variant.field4 + 0x18));
        bVar1 = docopt::value::operator_cast_to_bool((value *)local_238);
        if (bVar1) {
          docopt::value::value(&local_340,(value *)local_238);
        }
        else {
          docopt::value::value(&local_340,true);
        }
        docopt::LeafPattern::setValue(&peVar7->super_LeafPattern,&local_340);
        docopt::value::~value(&local_340);
      }
      std::shared_ptr<docopt::Pattern>::shared_ptr<docopt::Option,void>
                (&local_350,(shared_ptr<docopt::Option> *)((long)&val.variant.strValue.field_2 + 8))
      ;
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      push_back(__return_storage_ptr__,&local_350);
      std::shared_ptr<docopt::Pattern>::~shared_ptr(&local_350);
      docopt::value::~value((value *)local_238);
      std::shared_ptr<docopt::Option>::~shared_ptr
                ((shared_ptr<docopt::Option> *)((long)&val.variant.strValue.field_2 + 8));
    }
    std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>::~vector
              ((vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *)&__range2)
    ;
    std::__cxx11::string::~string((string *)local_d8);
  }
  std::operator+(&local_190,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 " is specified ambiguously ");
  sVar5 = std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>::size
                    ((vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *)
                     &__range2);
  std::__cxx11::to_string(&local_1b0,sVar5);
  std::operator+(&local_170,&local_190,&local_1b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                 &local_170," times");
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_190);
  pOVar6 = (OptionError *)__cxa_allocate_exception(0x10);
  Tokens::OptionError::runtime_error(pOVar6,(string *)local_150);
  __cxa_throw(pOVar6,&Tokens::OptionError::typeinfo,Tokens::OptionError::~OptionError);
}

Assistant:

static PatternList parse_short(Tokens& tokens, std::vector<Option>& options)
{
	// shorts ::= '-' ( chars )* [ [ ' ' ] chars ] ;

	auto token = tokens.pop();

	assert(starts_with(token, "-"));
	assert(!starts_with(token, "--"));

	auto i = token.begin();
	++i; // skip the leading '-'

	PatternList ret;
	while (i != token.end()) {
		std::string shortOpt = { '-', *i };
		++i;

		std::vector<Option const*> similar;
		for(auto const& option : options) {
			if (option.shortOption()==shortOpt)
				similar.push_back(&option);
		}

		if (similar.size() > 1) {
			std::string error = shortOpt + " is specified ambiguously "
			+ std::to_string(similar.size()) + " times";
			throw Tokens::OptionError(std::move(error));
		} else if (similar.empty()) {
			options.emplace_back(shortOpt, "", 0);

			auto o = std::make_shared<Option>(options.back());
			if (tokens.isParsingArgv()) {
				o->setValue(value{true});
			}
			ret.push_back(o);
		} else {
			auto o = std::make_shared<Option>(*similar[0]);
			value val;
			if (o->argCount()) {
				if (i == token.end()) {
					// consume the next token
					auto const& ttoken = tokens.current();
					if (ttoken.empty() || ttoken=="--") {
						std::string error = shortOpt + " requires an argument";
						throw Tokens::OptionError(std::move(error));
					}
					val = tokens.pop();
				} else {
					// consume all the rest
					val = std::string{i, token.end()};
					i = token.end();
				}
			}

			if (tokens.isParsingArgv()) {
				o->setValue(val ? std::move(val) : value{true});
			}
			ret.push_back(o);
		}
	}

	return ret;
}